

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O3

bool __thiscall gui::ChatBox::handleKeyPressed(ChatBox *this,KeyEvent *key)

{
  Key KVar1;
  _Map_pointer ppCVar2;
  ulong uVar3;
  bool bVar4;
  reference left;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  int delta;
  ulong __n;
  String selectedText;
  locale local_b8 [8];
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  
  bVar4 = Widget::handleKeyPressed(&this->super_Widget,key);
  if (this->autoHide_ != false) {
    return bVar4;
  }
  KVar1 = key->code;
  if (key->control == true) {
    if ((KVar1 == X) || (KVar1 == C)) {
      if ((this->selectionStart_).second != true) {
        return true;
      }
      sf::String::String(&local_50);
      __n = (this->selectionStart_).first;
      uVar3 = this->selectionEnd_;
      uVar6 = uVar3;
      if (uVar3 < __n) {
        uVar6 = __n;
        __n = uVar3;
      }
      do {
        left = std::_Deque_iterator<gui::ChatBoxLine,_gui::ChatBoxLine_&,_gui::ChatBoxLine_*>::
               operator[](&(this->lines_).
                           super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>.
                           _M_impl.super__Deque_impl_data._M_start,__n);
        std::locale::locale(local_b8);
        sf::String::String(&local_b0,"\n",local_b8);
        sf::operator+(&local_90,&left->str,&local_b0);
        sf::operator+(&local_70,&local_90,&local_50);
        sf::String::operator=(&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
             *)local_70.m_string._M_dataplus._M_p != &local_70.m_string.field_2) {
          operator_delete(local_70.m_string._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
             *)local_90.m_string._M_dataplus._M_p != &local_90.m_string.field_2) {
          operator_delete(local_90.m_string._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
             *)local_b0.m_string._M_dataplus._M_p != &local_b0.m_string.field_2) {
          operator_delete(local_b0.m_string._M_dataplus._M_p);
        }
        std::locale::~locale(local_b8);
        __n = __n + 1;
      } while (__n <= uVar6);
      sf::Clipboard::setString(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)local_50.m_string._M_dataplus._M_p == &local_50.m_string.field_2) {
        return true;
      }
      operator_delete(local_50.m_string._M_dataplus._M_p);
      return true;
    }
    if (KVar1 != A) {
      return bVar4;
    }
    ppCVar2 = (this->lines_).super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    if (((long)(this->lines_).super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->lines_).super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
        (((long)ppCVar2 -
          (long)(this->lines_).
                super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(ppCVar2 == (_Map_pointer)0x0)) * 10 ==
        ((long)(this->lines_).super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(this->lines_).super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * 0x5555555555555555) {
      return true;
    }
    updateSelection(this,0,false);
    ppCVar2 = (this->lines_).super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    updateSelection(this,(((long)(this->lines_).
                                 super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)(this->lines_).
                                 super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) *
                          -0x5555555555555555 +
                         ((long)(this->lines_).
                                super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)(this->lines_).
                                super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) *
                         -0x5555555555555555 +
                         (((long)ppCVar2 -
                           (long)(this->lines_).
                                 super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                         (ulong)(ppCVar2 == (_Map_pointer)0x0)) * 10) - 1,true);
    return true;
  }
  switch(KVar1) {
  case PageUp:
    delta = (int)(this->sizeCharacters_).y + -1;
    break;
  case PageDown:
    delta = 1 - (int)(this->sizeCharacters_).y;
    break;
  case End:
    ppCVar2 = (this->lines_).super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar7 = ((long)(this->lines_).
                   super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last -
             (long)(this->lines_).
                   super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
            ((long)(this->lines_).
                   super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur -
             (long)(this->lines_).
                   super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
            (((long)ppCVar2 -
              (long)(this->lines_).
                    super__Deque_base<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppCVar2 == (_Map_pointer)0x0)) * 10;
    sVar5 = 0;
    if (lVar7 != 0) {
      sVar5 = lVar7 - 1;
    }
    this->verticalScroll_ = sVar5;
    goto LAB_00182ed1;
  case Home:
    this->verticalScroll_ = 0;
LAB_00182ed1:
    this->visibleLinesChanged_ = true;
    Widget::requestRedraw(&this->super_Widget);
    goto LAB_00182eef;
  default:
    goto switchD_00182d04_caseD_41;
  case Up:
    delta = 1;
    break;
  case Down:
    delta = -1;
  }
  updateScroll(this,delta);
LAB_00182eef:
  bVar4 = true;
switchD_00182d04_caseD_41:
  return bVar4;
}

Assistant:

bool ChatBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    if (autoHide_) {
        return eventConsumed;
    }

    if (key.control) {
        if (key.code == sf::Keyboard::A) {
            if (lines_.size() > 0) {
                updateSelection(0, false);
                updateSelection(lines_.size() - 1, true);
            }
        } else if (key.code == sf::Keyboard::X || key.code == sf::Keyboard::C) {
            if (selectionStart_.second) {
                sf::String selectedText;
                size_t selectionMin = std::min(selectionStart_.first, selectionEnd_);
                size_t selectionMax = std::max(selectionStart_.first, selectionEnd_);
                for (size_t i = selectionMin; i <= selectionMax; ++i) {
                    selectedText = lines_[i].str + "\n" + selectedText;
                }
                sf::Clipboard::setString(selectedText);
            }
        } else {
            return eventConsumed;
        }
        return true;
    }

    if (key.code == sf::Keyboard::PageUp) {
        updateScroll(static_cast<int>(sizeCharacters_.y) - 1);
    } else if (key.code == sf::Keyboard::PageDown) {
        updateScroll(-static_cast<int>(sizeCharacters_.y) + 1);
    } else if (key.code == sf::Keyboard::Home) {
        verticalScroll_ = 0;
        updateVisibleLines();
    } else if (key.code == sf::Keyboard::End) {
        verticalScroll_ = (lines_.size() > 0 ? lines_.size() - 1 : 0);
        updateVisibleLines();
    } else if (key.code == sf::Keyboard::Up) {
        updateScroll(1);
    } else if (key.code == sf::Keyboard::Down) {
        updateScroll(-1);
    } else {
        return eventConsumed;
    }
    return true;
}